

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfad.h
# Opt level: O0

void __thiscall
TFad<6,double>::
TFad<TFadFuncSqrt<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFad<6,double>,TFadCst<double>>>,TFadExpr<TFadBinaryPow<TFad<6,double>,TFadCst<double>>>>>,TFadExpr<TFadBinaryPow<TFad<6,double>,TFadCst<double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFad<6,double>>>>>
          (TFad<6,_double> *this,
          TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFad<6,_double>_>_>_>_>
          *fadexpr)

{
  TPZSavable *in_RDI;
  _func_int **pp_Var1;
  int i;
  int in_stack_ffffffffffffffbc;
  TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFad<6,_double>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  int local_20;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_023f51f8);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TFad_023f51a8;
  pp_Var1 = (_func_int **)
            TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFad<6,_double>_>_>_>_>
            ::val((TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFad<6,_double>_>_>_>_>
                   *)0x14ced1e);
  in_RDI[1]._vptr_TPZSavable = pp_Var1;
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    in_stack_ffffffffffffffc0 =
         (TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFad<6,_double>_>_>_>_>
          *)TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFad<6,_double>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFad<6,_double>_>_>_>_>
            ::dx(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    in_RDI[(long)local_20 + 2]._vptr_TPZSavable = (_func_int **)in_stack_ffffffffffffffc0;
  }
  return;
}

Assistant:

inline 
TFad<Num,T>::TFad(const TFadExpr<ExprT>& fadexpr) 
: val_(fadexpr.val())
{

  for(int i=0; i<Num; ++i) 
    dx_[i] = fadexpr.dx(i);

}